

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

int parse_and_tune(regex_t *reg,OnigUChar *pattern,OnigUChar *pattern_end,ParseEnv *scan_env,
                  Node **rroot,OnigErrorInfo *einfo,UnsetAddrList *uslist)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  UnsetAddr *pUVar4;
  Node **ppNVar5;
  Node *root;
  Node *local_38;
  
  ppNVar5 = &local_38;
  local_38 = (Node *)0x0;
  if (einfo != (OnigErrorInfo *)0x0) {
    einfo->enc = reg->enc;
    einfo->par = (OnigUChar *)0x0;
  }
  iVar3 = onig_parse_tree(&local_38,pattern,pattern_end,reg,scan_env);
  if (iVar3 == 0) {
    if ((scan_env->flags & 2) != 0) {
      bVar2 = false;
      while( true ) {
        piVar1 = (int *)*ppNVar5;
        if (*piVar1 != 7) break;
        if (*(long *)(piVar1 + 6) != 0) {
          bVar2 = true;
        }
        ppNVar5 = (Node **)(piVar1 + 4);
      }
      iVar3 = -0x78;
      if ((((*piVar1 != 5) || (piVar1[6] != 1)) || ((*(byte *)((long)piVar1 + 7) & 0x10) == 0)) ||
         ((bVar2 && (*(long *)(piVar1 + 4) != 0)))) {
        bVar2 = false;
      }
      else {
        iVar3 = 0;
        bVar2 = true;
      }
      if (!bVar2) goto LAB_0011c6da;
    }
    iVar3 = reduce_string_list(local_38,reg->enc);
    if (iVar3 == 0) {
      if (((0 < scan_env->num_named) && ((scan_env->syntax->behavior & 0x80) != 0)) &&
         ((reg->options & 0x100) == 0)) {
        if (scan_env->num_named == scan_env->num_mem) {
          iVar3 = numbered_ref_check(local_38);
        }
        else {
          iVar3 = disable_noname_group_capture(&local_38,reg,scan_env);
        }
        if (iVar3 != 0) goto LAB_0011c6da;
      }
      iVar3 = check_backrefs(local_38,scan_env);
      if (iVar3 == 0) {
        iVar3 = scan_env->num_call;
        if ((long)iVar3 < 1) {
LAB_0011c7be:
          reg->num_call = scan_env->num_call;
          iVar3 = tune_tree(local_38,reg,0,scan_env);
          if (iVar3 == 0) {
            if (scan_env->backref_num != 0) {
              set_parent_node_trav(local_38,(Node *)0x0);
              set_empty_repeat_node_trav(local_38,(Node *)0x0,scan_env);
              set_empty_status_check_trav(local_38,scan_env);
            }
            iVar3 = 0;
            goto LAB_0011c716;
          }
        }
        else {
          pUVar4 = (UnsetAddr *)malloc((long)iVar3 << 4);
          if (pUVar4 == (UnsetAddr *)0x0) {
            iVar3 = -5;
            goto LAB_0011c6da;
          }
          uslist->num = 0;
          uslist->alloc = iVar3;
          uslist->us = pUVar4;
          scan_env->unset_addr_list = uslist;
          iVar3 = tune_call(local_38,scan_env,0);
          if (iVar3 == 0) {
            tune_call2(local_38);
            iVar3 = recursive_call_check_trav(local_38,scan_env,0);
            if ((-1 < iVar3) &&
               (iVar3 = infinite_recursive_call_check_trav(local_38,scan_env), iVar3 == 0)) {
              tune_called_state(local_38,0);
              goto LAB_0011c7be;
            }
          }
        }
        if ((0 < scan_env->num_call) && (uslist->us != (UnsetAddr *)0x0)) {
          free(uslist->us);
        }
      }
    }
  }
LAB_0011c6da:
  if (scan_env->error != (OnigUChar *)0x0 && einfo != (OnigErrorInfo *)0x0) {
    einfo->par = scan_env->error;
    einfo->par_end = scan_env->error_end;
  }
  onig_node_free(local_38);
  if (scan_env->mem_env_dynamic != (MemEnv *)0x0) {
    free(scan_env->mem_env_dynamic);
  }
  local_38 = (Node *)0x0;
LAB_0011c716:
  *rroot = local_38;
  return iVar3;
}

Assistant:

static int parse_and_tune(regex_t* reg, const UChar* pattern,
  const UChar* pattern_end, ParseEnv *scan_env, Node** rroot,
  OnigErrorInfo* einfo
#ifdef USE_CALL
  , UnsetAddrList* uslist
#endif
)
{
  int r;
  Node* root;

  root = NULL_NODE;
  if (IS_NOT_NULL(einfo)) {
    einfo->enc = reg->enc;
    einfo->par = (UChar* )NULL;
  }

  r = onig_parse_tree(&root, pattern, pattern_end, reg, scan_env);
  if (r != 0) goto err;

#ifdef USE_WHOLE_OPTIONS
  if ((scan_env->flags & PE_FLAG_HAS_WHOLE_OPTIONS) != 0) {
    r = check_whole_options_position(root);
    if (r != 0) goto err;
  }
#endif

  r = reduce_string_list(root, reg->enc);
  if (r != 0) goto err;

  /* mixed use named group and no-named group */
  if (scan_env->num_named > 0 &&
      IS_SYNTAX_BV(scan_env->syntax, ONIG_SYN_CAPTURE_ONLY_NAMED_GROUP) &&
      ! OPTON_CAPTURE_GROUP(reg->options)) {
    if (scan_env->num_named != scan_env->num_mem)
      r = disable_noname_group_capture(&root, reg, scan_env);
    else
      r = numbered_ref_check(root);

    if (r != 0) goto err;
  }

  r = check_backrefs(root, scan_env);
  if (r != 0) goto err;

#ifdef USE_CALL
  if (scan_env->num_call > 0) {
    r = unset_addr_list_init(uslist, scan_env->num_call);
    if (r != 0) goto err;
    scan_env->unset_addr_list = uslist;
    r = tune_call(root, scan_env, 0);
    if (r != 0) goto err_unset;
    r = tune_call2(root);
    if (r != 0) goto err_unset;
    r = recursive_call_check_trav(root, scan_env, 0);
    if (r  < 0) goto err_unset;
    r = infinite_recursive_call_check_trav(root, scan_env);
    if (r != 0) goto err_unset;

    tune_called_state(root, 0);
  }

  reg->num_call = scan_env->num_call;
#endif

#ifdef ONIG_DEBUG_PARSE
  fprintf(DBGFP, "MAX PARSE DEPTH: %d\n", scan_env->max_parse_depth);
#endif

  r = tune_tree(root, reg, 0, scan_env);
  if (r != 0) {
#ifdef ONIG_DEBUG_PARSE
    fprintf(DBGFP, "TREE (error in tune)\n");
    print_tree(DBGFP, root);
    fprintf(DBGFP, "\n");
#endif
    goto err_unset;
  }

  if (scan_env->backref_num != 0) {
    set_parent_node_trav(root, NULL_NODE);
    r = set_empty_repeat_node_trav(root, NULL_NODE, scan_env);
    if (r != 0) goto err_unset;
    set_empty_status_check_trav(root, scan_env);
  }

  *rroot = root;
  return r;

 err_unset:
#ifdef USE_CALL
  if (scan_env->num_call > 0) {
    unset_addr_list_end(uslist);
  }
#endif
 err:
  if (IS_NOT_NULL(scan_env->error)) {
    if (IS_NOT_NULL(einfo)) {
      einfo->par     = scan_env->error;
      einfo->par_end = scan_env->error_end;
    }
  }

  onig_node_free(root);
  if (IS_NOT_NULL(scan_env->mem_env_dynamic))
    xfree(scan_env->mem_env_dynamic);

  *rroot = NULL_NODE;
  return r;
}